

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *
pbrt::Image::resampleWeights
          (vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
           *__return_storage_ptr__,int oldRes,int newRes)

{
  Float *pFVar1;
  Float *pFVar2;
  pointer pRVar3;
  int j;
  long lVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  allocator_type local_5d;
  float local_5c;
  float local_58;
  float local_54;
  int vb;
  int va;
  undefined1 local_48 [16];
  
  vb = oldRes;
  va = newRes;
  if (oldRes <= newRes) {
    std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::vector
              (__return_storage_ptr__,(long)newRes,&local_5d);
    if (0 < newRes) {
      local_54 = (float)oldRes;
      local_58 = (float)newRes;
      lVar6 = 4;
      uVar5 = 0;
      auVar11 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      do {
        fVar13 = (((float)(int)uVar5 + 0.5) * local_54) / local_58;
        auVar8 = ZEXT416((uint)(fVar13 + -2.0 + 0.5));
        auVar8 = vroundss_avx(auVar8,auVar8,9);
        (__return_storage_ptr__->
        super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar5].firstTexel = (int)auVar8._0_4_;
        lVar4 = 0;
        local_5c = fVar13;
        do {
          fVar14 = ((float)((__return_storage_ptr__->
                            super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar5].firstTexel +
                           (int)lVar4) + 0.5) - fVar13;
          auVar8 = vandps_avx(ZEXT416((uint)fVar14),auVar11._0_16_);
          fVar9 = 0.0;
          if (auVar8._0_4_ <= 2.0) {
            fVar9 = fVar14 * 0.5 * 3.1415927;
            auVar10 = SUB6416(ZEXT464(0x3f800000),0);
            auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),auVar10);
            if ((auVar8._0_4_ != 1.0) || (NAN(auVar8._0_4_))) {
              local_48 = ZEXT416((uint)fVar14);
              fVar13 = sinf(fVar9);
              auVar11 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
              auVar10._0_4_ = fVar13 / fVar9;
              auVar10._4_12_ = extraout_var;
              fVar13 = local_5c;
              fVar14 = (float)local_48._0_4_;
            }
            fVar14 = fVar14 * 3.1415927;
            auVar12 = SUB6416(ZEXT464(0x3f800000),0);
            auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),auVar12);
            if ((auVar8._0_4_ != 1.0) || (fVar9 = auVar10._0_4_, NAN(auVar8._0_4_))) {
              local_48._0_4_ = auVar10._0_4_;
              fVar13 = sinf(fVar14);
              auVar11 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
              auVar12._0_4_ = fVar13 / fVar14;
              auVar12._4_12_ = extraout_var_00;
              fVar9 = (float)local_48._0_4_;
              fVar13 = local_5c;
            }
            fVar9 = auVar12._0_4_ * fVar9;
          }
          *(float *)((long)((__return_storage_ptr__->
                            super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                            )._M_impl.super__Vector_impl_data._M_start)->weight +
                    lVar4 * 4 + lVar6 + -4) = fVar9;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        pRVar3 = (__return_storage_ptr__->
                 super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        fVar7 = 1.0 / (pRVar3[uVar5].weight[0] + pRVar3[uVar5].weight[1] + pRVar3[uVar5].weight[2] +
                      pRVar3[uVar5].weight[3]);
        pFVar1 = pRVar3[uVar5].weight;
        fVar13 = pFVar1[1];
        fVar14 = pFVar1[2];
        fVar9 = pFVar1[3];
        pFVar2 = pRVar3[uVar5].weight;
        *pFVar2 = fVar7 * *pFVar1;
        pFVar2[1] = fVar7 * fVar13;
        pFVar2[2] = fVar7 * fVar14;
        pFVar2[3] = fVar7 * fVar9;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x14;
      } while (uVar5 != (uint)newRes);
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[7],char_const(&)[7],char_const(&)[7],int&,char_const(&)[7],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x154,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [7])"newRes",
             (char (*) [7])"oldRes",(char (*) [7])"newRes",&va,(char (*) [7])"oldRes",&vb);
}

Assistant:

std::vector<ResampleWeight> Image::resampleWeights(int oldRes, int newRes) {
    CHECK_GE(newRes, oldRes);
    std::vector<ResampleWeight> wt(newRes);
    Float filterwidth = 2.f;
    for (int i = 0; i < newRes; ++i) {
        // Compute image resampling weights for _i_th texel
        Float center = (i + .5f) * oldRes / newRes;
        wt[i].firstTexel = std::floor((center - filterwidth) + 0.5f);
        for (int j = 0; j < 4; ++j) {
            Float pos = wt[i].firstTexel + j + .5f;
            wt[i].weight[j] = WindowedSinc(pos - center, filterwidth, 2.f);
        }

        // Normalize filter weights for texel resampling
        Float invSumWts =
            1 / (wt[i].weight[0] + wt[i].weight[1] + wt[i].weight[2] + wt[i].weight[3]);
        for (int j = 0; j < 4; ++j)
            wt[i].weight[j] *= invSumWts;
    }
    return wt;
}